

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::LazyDescriptor::SetLazy
          (LazyDescriptor *this,string *name,FileDescriptor *file)

{
  string *psVar1;
  once_flag *poVar2;
  size_type in_RDX;
  long *in_RDI;
  undefined4 in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffd9c;
  LogMessage *in_stack_fffffffffffffda0;
  LogMessage *this_00;
  undefined8 in_stack_fffffffffffffda8;
  LogLevel_conflict level;
  Tables *in_stack_fffffffffffffdb0;
  LogMessage *in_stack_fffffffffffffdb8;
  Tables *in_stack_fffffffffffffdc0;
  LogMessage local_1e0;
  byte local_1a1;
  undefined1 local_1a0 [127];
  byte local_121;
  byte local_e1;
  byte local_a1;
  byte local_51;
  size_type local_18;
  
  level = (LogLevel_conflict)((ulong)in_stack_fffffffffffffda8 >> 0x20);
  local_51 = 0;
  local_18 = in_RDX;
  if (*in_RDI != 0) {
    LogMessage::LogMessage
              ((LogMessage *)in_stack_fffffffffffffdb0,level,(char *)in_stack_fffffffffffffda0,
               in_stack_fffffffffffffd9c);
    local_51 = 1;
    LogMessage::operator<<
              (in_stack_fffffffffffffda0,
               (char *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    LogFinisher::operator=
              ((LogFinisher *)in_stack_fffffffffffffda0,
               (LogMessage *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  }
  if ((local_51 & 1) != 0) {
    LogMessage::~LogMessage((LogMessage *)0x4cfe31);
  }
  local_a1 = 0;
  if (in_RDI[3] != 0) {
    LogMessage::LogMessage
              ((LogMessage *)in_stack_fffffffffffffdb0,level,(char *)in_stack_fffffffffffffda0,
               in_stack_fffffffffffffd9c);
    local_a1 = 1;
    LogMessage::operator<<
              (in_stack_fffffffffffffda0,
               (char *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    LogFinisher::operator=
              ((LogFinisher *)in_stack_fffffffffffffda0,
               (LogMessage *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  }
  if ((local_a1 & 1) != 0) {
    LogMessage::~LogMessage((LogMessage *)0x4cfebc);
  }
  local_e1 = 0;
  if (in_RDI[1] != 0) {
    LogMessage::LogMessage
              ((LogMessage *)in_stack_fffffffffffffdb0,level,(char *)in_stack_fffffffffffffda0,
               in_stack_fffffffffffffd9c);
    local_e1 = 1;
    LogMessage::operator<<
              (in_stack_fffffffffffffda0,
               (char *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    LogFinisher::operator=
              ((LogFinisher *)in_stack_fffffffffffffda0,
               (LogMessage *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  }
  if ((local_e1 & 1) != 0) {
    LogMessage::~LogMessage((LogMessage *)0x4cff47);
  }
  local_121 = 0;
  if (in_RDI[2] != 0) {
    LogMessage::LogMessage
              ((LogMessage *)in_stack_fffffffffffffdb0,level,(char *)in_stack_fffffffffffffda0,
               in_stack_fffffffffffffd9c);
    local_121 = 1;
    LogMessage::operator<<
              (in_stack_fffffffffffffda0,
               (char *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    LogFinisher::operator=
              ((LogFinisher *)in_stack_fffffffffffffda0,
               (LogMessage *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  }
  if ((local_121 & 1) != 0) {
    LogMessage::~LogMessage((LogMessage *)0x4cffd2);
  }
  local_1a0[0x3f] = 0;
  if ((local_18 == 0) || (*(long *)(local_18 + 0x10) == 0)) {
    in_stack_fffffffffffffdc0 = (Tables *)(local_1a0 + 0x40);
    LogMessage::LogMessage
              ((LogMessage *)in_stack_fffffffffffffdb0,level,(char *)in_stack_fffffffffffffda0,
               in_stack_fffffffffffffd9c);
    local_1a0[0x3f] = 1;
    LogMessage::operator<<
              (in_stack_fffffffffffffda0,
               (char *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    LogFinisher::operator=
              ((LogFinisher *)in_stack_fffffffffffffda0,
               (LogMessage *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  }
  if ((local_1a0[0x3f] & 1) != 0) {
    LogMessage::~LogMessage((LogMessage *)0x4d006b);
  }
  local_1a1 = 0;
  if ((*(byte *)(*(long *)(local_18 + 0x10) + 0x29) & 1) == 0) {
    in_stack_fffffffffffffdb0 = (Tables *)local_1a0;
    LogMessage::LogMessage
              ((LogMessage *)in_stack_fffffffffffffdb0,level,(char *)in_stack_fffffffffffffda0,
               in_stack_fffffffffffffd9c);
    local_1a1 = 1;
    in_stack_fffffffffffffdb8 =
         LogMessage::operator<<
                   (in_stack_fffffffffffffda0,
                    (char *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    LogFinisher::operator=
              ((LogFinisher *)in_stack_fffffffffffffda0,
               (LogMessage *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  }
  if ((local_1a1 & 1) != 0) {
    LogMessage::~LogMessage((LogMessage *)0x4d00fa);
  }
  if ((*(byte *)(local_18 + 0x41) & 1) != 0) {
    this_00 = &local_1e0;
    LogMessage::LogMessage
              ((LogMessage *)in_stack_fffffffffffffdb0,level,(char *)this_00,
               in_stack_fffffffffffffd9c);
    LogMessage::operator<<
              (this_00,(char *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    LogFinisher::operator=
              ((LogFinisher *)this_00,
               (LogMessage *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    LogMessage::~LogMessage((LogMessage *)0x4d0185);
  }
  in_RDI[3] = local_18;
  std::
  unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
  ::operator->((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                *)0x4d01ab);
  psVar1 = DescriptorPool::Tables::AllocateString
                     (in_stack_fffffffffffffdc0,(string *)in_stack_fffffffffffffdb8);
  in_RDI[1] = (long)psVar1;
  std::
  unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
  ::operator->((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                *)0x4d01dc);
  poVar2 = DescriptorPool::Tables::AllocateOnceDynamic(in_stack_fffffffffffffdb0);
  in_RDI[2] = (long)poVar2;
  return;
}

Assistant:

void LazyDescriptor::SetLazy(const std::string& name,
                             const FileDescriptor* file) {
  // verify Init() has been called and Set hasn't been called yet.
  GOOGLE_CHECK(!descriptor_);
  GOOGLE_CHECK(!file_);
  GOOGLE_CHECK(!name_);
  GOOGLE_CHECK(!once_);
  GOOGLE_CHECK(file && file->pool_);
  GOOGLE_CHECK(file->pool_->lazily_build_dependencies_);
  GOOGLE_CHECK(!file->finished_building_);
  file_ = file;
  name_ = file->pool_->tables_->AllocateString(name);
  once_ = file->pool_->tables_->AllocateOnceDynamic();
}